

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall
kratos::Generator::add_child_generator
          (Generator *this,string *instance_name_,shared_ptr<kratos::Generator> *child)

{
  initializer_list<kratos::IRNode_*> __l;
  bool bVar1;
  element_type *peVar2;
  GeneratorException *this_00;
  __shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *this_01;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_false,_true>,_bool>
  pVar3;
  format_args args;
  string_view format_str;
  allocator<kratos::IRNode_*> local_131;
  element_type *local_130;
  element_type **local_128;
  size_type local_120;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_118;
  string local_f0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
  local_d0;
  undefined1 local_c8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
  local_c0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
  local_b8;
  __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_b0;
  shared_ptr<kratos::Generator> *child_local;
  string *instance_name__local;
  Generator *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  string *local_48;
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_b0 = (__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             child;
  child_local = (shared_ptr<kratos::Generator> *)instance_name_;
  instance_name__local = (string *)this;
  peVar2 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)child);
  std::__cxx11::string::operator=((string *)&peVar2->instance_name,(string *)instance_name_);
  peVar2 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_b0);
  local_b8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>_>
       ::find(&this->children_,&peVar2->instance_name);
  local_c0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>_>
       ::end(&this->children_);
  bVar1 = std::__detail::operator==(&local_b8,&local_c0);
  if (!bVar1) {
    this_00 = (GeneratorException *)__cxa_allocate_exception(0x10);
    peVar2 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_b0);
    local_48 = &peVar2->instance_name;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&this->instance_name;
    local_38 = &local_f0;
    local_40 = "{0} already exists  in {1}";
    fmt::v7::make_args_checked<std::__cxx11::string&,std::__cxx11::string&,char[27],char>
              (&local_78,(v7 *)"{0} already exists  in {1}",(char (*) [27])local_48,
               (remove_reference_t<std::__cxx11::basic_string<char>_&> *)vargs,in_R8);
    local_58 = &local_78;
    local_88 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_30 = local_58;
    local_20 = local_58;
    local_10 = local_58;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_58);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_90.values_;
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_88.size_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_f0,(detail *)local_88.data_,format_str,args);
    this_01 = &std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>_>
               ::at(&this->children_,(key_type *)child_local)->
               super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>;
    local_130 = std::__shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>::get(this_01);
    local_128 = &local_130;
    local_120 = 1;
    std::allocator<kratos::IRNode_*>::allocator(&local_131);
    __l._M_len = local_120;
    __l._M_array = (iterator)local_128;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              (&local_118,__l,&local_131);
    GeneratorException::GeneratorException(this_00,&local_f0,&local_118);
    __cxa_throw(this_00,&GeneratorException::typeinfo,GeneratorException::~GeneratorException);
  }
  peVar2 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_b0);
  pVar3 = std::
          unordered_map<std::__cxx11::string,std::shared_ptr<kratos::Generator>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Generator>>>>
          ::emplace<std::__cxx11::string&,std::shared_ptr<kratos::Generator>const&>
                    ((unordered_map<std::__cxx11::string,std::shared_ptr<kratos::Generator>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Generator>>>>
                      *)&this->children_,&peVar2->instance_name,
                     (shared_ptr<kratos::Generator> *)local_b0);
  local_d0._M_cur =
       (__node_type *)
       pVar3.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
       ._M_cur;
  local_c8 = pVar3.second;
  peVar2 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_b0);
  peVar2->parent_generator_ = this;
  peVar2 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_b0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->children_names_,&peVar2->instance_name);
  return;
}

Assistant:

void Generator::add_child_generator(const std::string &instance_name_,
                                    const std::shared_ptr<Generator> &child) {
    child->instance_name = instance_name_;
    if (children_.find(child->instance_name) == children_.end()) {
        children_.emplace(child->instance_name, child);
        child->parent_generator_ = this;
        children_names_.emplace_back(child->instance_name);
    } else {
        throw GeneratorException(
            ::format("{0} already exists  in {1}", child->instance_name, instance_name),
            {children_.at(instance_name_).get()});
    }
}